

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

void Llb_ManCutPrint(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *vMinCut;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  lVar6 = (long)vLower->nSize;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  if (0 < vLower->nSize) {
    lVar7 = 0;
    do {
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  uVar5 = 0;
  printf("Leaf: %3d=%3d+%3d+%3d  ");
  uVar4 = 0;
  if (0 < (long)vUpper->nSize) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      uVar1 = 0;
      if ((*(uint *)((long)vUpper->pArray[lVar6] + 0x18) & 7) == 2) {
        uVar1 = (uint)(*vUpper->pArray[lVar6] < p->nTruePis);
      }
      uVar4 = uVar4 + uVar1;
      lVar6 = lVar6 + 1;
    } while (vUpper->nSize != lVar6);
  }
  uVar1 = Llb_ManCutLiNum(p,vUpper);
  printf("Root: %3d=%3d+%3d+%3d  ",(ulong)(uint)vUpper->nSize,(ulong)uVar4,(ulong)uVar1,
         (ulong)((vUpper->nSize - uVar1) - uVar4));
  __ptr = Llb_ManCutSupp(p,vLower,vUpper);
  uVar4 = __ptr->nSize;
  lVar6 = (long)(int)uVar4;
  if (0 < lVar6) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      uVar1 = 0;
      if ((*(uint *)((long)__ptr->pArray[lVar7] + 0x18) & 7) == 2) {
        uVar1 = (uint)(*__ptr->pArray[lVar7] < p->nTruePis);
      }
      uVar5 = uVar5 + uVar1;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  uVar1 = 0;
  uVar3 = 0;
  if (0 < (int)uVar4) {
    lVar7 = 0;
    uVar3 = 0;
    do {
      uVar2 = 0;
      if ((*(uint *)((long)__ptr->pArray[lVar7] + 0x18) & 7) == 2) {
        uVar2 = (uint)(p->nTruePis <= *__ptr->pArray[lVar7]);
      }
      uVar3 = (ulong)((int)uVar3 + uVar2);
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  printf("Supp: %3d=%3d+%3d+%3d  ",(ulong)uVar4,(ulong)uVar5,uVar3,
         (ulong)((uVar4 - uVar5) - (int)uVar3));
  vMinCut = Llb_ManCutRange(p,vLower,vUpper);
  uVar5 = vMinCut->nSize;
  if (0 < (long)(int)uVar5) {
    lVar6 = 0;
    uVar1 = 0;
    do {
      uVar2 = 0;
      if ((*(uint *)((long)vMinCut->pArray[lVar6] + 0x18) & 7) == 2) {
        uVar2 = (uint)(*vMinCut->pArray[lVar6] < p->nTruePis);
      }
      uVar1 = uVar1 + uVar2;
      lVar6 = lVar6 + 1;
    } while ((int)uVar5 != lVar6);
  }
  uVar2 = Llb_ManCutLiNum(p,vMinCut);
  printf("Range: %3d=%3d+%3d+%3d  ",(ulong)uVar5,(ulong)uVar1,(ulong)uVar2,
         (ulong)((uVar5 - uVar1) - uVar2));
  uVar1 = Llb_ManCutVolume(p,vLower,vUpper);
  printf("S =%3d. V =%3d.\n",(ulong)(uVar5 + uVar4),(ulong)uVar1);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  if (vMinCut->pArray != (void **)0x0) {
    free(vMinCut->pArray);
    vMinCut->pArray = (void **)0x0;
  }
  if (vMinCut != (Vec_Ptr_t *)0x0) {
    free(vMinCut);
    return;
  }
  return;
}

Assistant:

void Llb_ManCutPrint( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vSupp, * vRange;
    int Pis, Ffs, And;

    Pis = Llb_ManCutPiNum(p, vLower);
    Ffs = Llb_ManCutLoNum(p, vLower);
    And = Vec_PtrSize(vLower) - Pis - Ffs;
    printf( "Leaf: %3d=%3d+%3d+%3d  ",  Vec_PtrSize(vLower), Pis, Ffs, And );

    Pis = Llb_ManCutPiNum(p, vUpper);
    Ffs = Llb_ManCutLiNum(p, vUpper);
    And = Vec_PtrSize(vUpper) - Pis - Ffs;
    printf( "Root: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vUpper), Pis, Ffs, And );

    vSupp = Llb_ManCutSupp( p, vLower, vUpper );
    Pis = Llb_ManCutPiNum(p, vSupp);
    Ffs = Llb_ManCutLoNum(p, vSupp);
    And = Vec_PtrSize(vSupp) - Pis - Ffs;
    printf( "Supp: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vSupp), Pis, Ffs, And );

    vRange = Llb_ManCutRange( p, vLower, vUpper );
    Pis = Llb_ManCutPiNum(p, vRange);
    Ffs = Llb_ManCutLiNum(p, vRange);
    And = Vec_PtrSize(vRange) - Pis - Ffs;
    printf( "Range: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vRange), Pis, Ffs, And );

    printf( "S =%3d. V =%3d.\n", 
        Vec_PtrSize(vSupp)+Vec_PtrSize(vRange), Llb_ManCutVolume(p, vLower, vUpper) );
    Vec_PtrFree( vSupp );
    Vec_PtrFree( vRange );
/*   
    {
        Aig_Obj_t * pObj;
        int i;
        printf( "Lower: " );
        Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
            printf( " %d", pObj->Id );
        printf( "     " );
        printf( "Upper: " );
        Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
            printf( " %d", pObj->Id );
        printf( "\n" );
    }
*/
}